

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::TransformerLinLog>::operator()
          (StairsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  int iVar7;
  ImU32 IVar8;
  uint uVar9;
  GetterYs<signed_char> *pGVar10;
  TransformerLinLog *pTVar11;
  ImPlotPlot *pIVar12;
  ImDrawVert *pIVar13;
  ImDrawIdx *pIVar14;
  ImPlotContext *pIVar15;
  bool bVar16;
  ImDrawIdx IVar17;
  double dVar18;
  ImVec2 IVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  pIVar15 = GImPlot;
  pGVar10 = this->Getter;
  dVar3 = pGVar10->XScale;
  dVar4 = pGVar10->X0;
  pTVar11 = this->Transformer;
  iVar7 = pGVar10->Count;
  dVar18 = log10((double)(int)pGVar10->Ys
                              [(long)(((prim + 1 + pGVar10->Offset) % iVar7 + iVar7) % iVar7) *
                               (long)pGVar10->Stride] /
                 GImPlot->CurrentPlot->YAxis[pTVar11->YAxis].Range.Min);
  iVar7 = pTVar11->YAxis;
  pIVar12 = pIVar15->CurrentPlot;
  dVar5 = pIVar12->YAxis[iVar7].Range.Min;
  IVar19.x = (float)((((double)(prim + 1) * dVar3 + dVar4) - (pIVar12->XAxis).Range.Min) *
                     pIVar15->Mx + (double)pIVar15->PixelRange[iVar7].Min.x);
  fVar20 = (float)((((double)(float)(dVar18 / pIVar15->LogDenY[iVar7]) *
                     (pIVar12->YAxis[iVar7].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar15->My[iVar7] + (double)pIVar15->PixelRange[iVar7].Min.y);
  fVar2 = (this->P1).x;
  fVar21 = (this->P1).y;
  fVar22 = fVar21;
  if (fVar20 <= fVar21) {
    fVar22 = fVar20;
  }
  bVar16 = false;
  if ((fVar22 < (cull_rect->Max).y) &&
     (fVar21 = (float)(-(uint)(fVar20 <= fVar21) & (uint)fVar21 |
                      ~-(uint)(fVar20 <= fVar21) & (uint)fVar20), pfVar1 = &(cull_rect->Min).y,
     bVar16 = false, *pfVar1 <= fVar21 && fVar21 != *pfVar1)) {
    fVar21 = fVar2;
    if (IVar19.x <= fVar2) {
      fVar21 = IVar19.x;
    }
    if (fVar21 < (cull_rect->Max).x) {
      fVar21 = (float)(~-(uint)(IVar19.x <= fVar2) & (uint)IVar19.x |
                      -(uint)(IVar19.x <= fVar2) & (uint)fVar2);
      bVar16 = (cull_rect->Min).x <= fVar21 && fVar21 != (cull_rect->Min).x;
    }
  }
  if (bVar16 != false) {
    fVar21 = (this->P1).y;
    fVar22 = fVar21 + this->HalfWeight;
    fVar21 = fVar21 - this->HalfWeight;
    IVar8 = this->Col;
    IVar6 = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    (pIVar13->pos).x = fVar2;
    (pIVar13->pos).y = fVar22;
    DrawList->_VtxWritePtr->uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = IVar8;
    pIVar13[1].pos.x = IVar19.x;
    pIVar13[1].pos.y = fVar21;
    DrawList->_VtxWritePtr[1].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = IVar8;
    pIVar13[2].pos.x = fVar2;
    pIVar13[2].pos.y = fVar21;
    pIVar13[2].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = IVar8;
    pIVar13[3].pos.x = IVar19.x;
    pIVar13[3].pos.y = fVar22;
    pIVar13[3].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = IVar8;
    DrawList->_VtxWritePtr = pIVar13 + 4;
    uVar9 = DrawList->_VtxCurrentIdx;
    pIVar14 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar9;
    *pIVar14 = IVar17;
    pIVar14[1] = IVar17 + 1;
    pIVar14[2] = IVar17 + 2;
    pIVar14[3] = IVar17;
    pIVar14[4] = IVar17 + 1;
    pIVar14[5] = IVar17 + 3;
    DrawList->_IdxWritePtr = pIVar14 + 6;
    DrawList->_VtxCurrentIdx = uVar9 + 4;
    fVar22 = IVar19.x - this->HalfWeight;
    fVar21 = this->HalfWeight + IVar19.x;
    fVar2 = (this->P1).y;
    IVar8 = this->Col;
    IVar6 = *uv;
    pIVar13[4].pos.x = fVar22;
    pIVar13[4].pos.y = fVar20;
    DrawList->_VtxWritePtr->uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = IVar8;
    pIVar13[1].pos.x = fVar21;
    pIVar13[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = IVar8;
    pIVar13[2].pos.x = fVar22;
    pIVar13[2].pos.y = fVar2;
    pIVar13[2].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = IVar8;
    pIVar13[3].pos.x = fVar21;
    pIVar13[3].pos.y = fVar20;
    pIVar13[3].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = IVar8;
    DrawList->_VtxWritePtr = pIVar13 + 4;
    uVar9 = DrawList->_VtxCurrentIdx;
    pIVar14 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar9;
    *pIVar14 = IVar17;
    pIVar14[1] = IVar17 + 1;
    pIVar14[2] = IVar17 + 2;
    pIVar14[3] = IVar17;
    pIVar14[4] = IVar17 + 1;
    pIVar14[5] = IVar17 + 3;
    DrawList->_IdxWritePtr = pIVar14 + 6;
    DrawList->_VtxCurrentIdx = uVar9 + 4;
  }
  IVar19.y = fVar20;
  this->P1 = IVar19;
  return bVar16;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }